

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O2

void com_ipred_c(pel *dst,int i_dst,pel *src,pel *luma,s16 *tmp_dst,int ipm_c,int ipm,int w,int h,
                int bit_depth,u16 avail_cu,pel *piRecoY,int uiStrideY)

{
  pel *ppVar1;
  _func_void_pel_ptr_pel_ptr_int_int_int *UNRECOVERED_JUMPTABLE;
  _func_void_pel_ptr_pel_ptr_int_int_int_int *UNRECOVERED_JUMPTABLE_00;
  
  switch(ipm_c) {
  case 0:
    if (ipm == 0) goto switchD_001189ff_caseD_1;
    if (ipm == 0x18) goto switchD_001189ff_caseD_2;
    if (ipm == 2) goto switchD_001189ff_caseD_4;
    if (ipm != 0xc) {
      UNRECOVERED_JUMPTABLE_00 = uavs3d_funs_handle.intra_pred_plane[1];
      if (ipm != 1) {
        (*uavs3d_funs_handle.intra_pred_chroma_ang[ipm])(src,dst,i_dst,ipm,w,h);
        return;
      }
      goto LAB_00118a44;
    }
  case 3:
    ppVar1 = src + 2;
    w = w * 2;
    UNRECOVERED_JUMPTABLE = uavs3d_funs_handle.intra_pred_ver[1];
    break;
  case 1:
switchD_001189ff_caseD_1:
    (*uavs3d_funs_handle.intra_pred_dc[1])(src,dst,i_dst,w,h,avail_cu,bit_depth);
    return;
  case 2:
switchD_001189ff_caseD_2:
    ppVar1 = src + -2;
    UNRECOVERED_JUMPTABLE = uavs3d_funs_handle.intra_pred_hor[1];
    break;
  case 4:
switchD_001189ff_caseD_4:
    UNRECOVERED_JUMPTABLE_00 = uavs3d_funs_handle.intra_pred_bi[1];
LAB_00118a44:
    (*UNRECOVERED_JUMPTABLE_00)(src,dst,i_dst,w,h,bit_depth);
    return;
  case 5:
    ipred_tscpm(dst,i_dst,src,luma,piRecoY,uiStrideY,w,h,avail_cu & 1,avail_cu & 2,bit_depth);
    return;
  default:
    puts("\n illegal chroma intra prediction mode");
    return;
  }
  (*UNRECOVERED_JUMPTABLE)(ppVar1,dst,i_dst,w,h);
  return;
}

Assistant:

void com_ipred_c(pel *dst, int i_dst, pel *src, pel *luma, s16 *tmp_dst, int ipm_c, int ipm, int w, int h, int bit_depth, u16 avail_cu, pel *piRecoY, int uiStrideY)
{
    uavs3d_assert(w <= 64 && h <= 64);

    if(ipm_c == IPD_DM_C && COM_IPRED_CHK_CONV(ipm)) {
        ipm_c = (ipm == IPD_VER) ? IPD_VER_C : (ipm == IPD_HOR ? IPD_HOR_C : (ipm == IPD_DC ? IPD_DC_C : IPD_BI_C));
    }

    switch(ipm_c) {
    case IPD_DM_C:
        switch(ipm) {
        case IPD_PLN:
            uavs3d_funs_handle.intra_pred_plane[UV_C](src, dst, i_dst, w, h, bit_depth);
            break;
        default:
            uavs3d_funs_handle.intra_pred_chroma_ang[ipm](src, dst, i_dst, ipm, w, h);
            break;
        }
        break;
    case IPD_DC_C:
        uavs3d_funs_handle.intra_pred_dc[UV_C](src, dst, i_dst, w, h, avail_cu, bit_depth);
        break;
    case IPD_HOR_C:
        uavs3d_funs_handle.intra_pred_hor[UV_C](src - 2, dst, i_dst, w, h);
        break;
    case IPD_VER_C:
        uavs3d_funs_handle.intra_pred_ver[UV_C](src + 2, dst, i_dst, w << 1, h);
        break;
    case IPD_BI_C:
        uavs3d_funs_handle.intra_pred_bi[UV_C](src, dst, i_dst, w, h, bit_depth);
        break;
    case IPD_TSCPM_C:
        ipred_tscpm(dst, i_dst, src, luma, piRecoY, uiStrideY, w,  h, IS_AVAIL(avail_cu, AVAIL_UP), IS_AVAIL(avail_cu, AVAIL_LE), bit_depth);
        break;

    default:
        printf("\n illegal chroma intra prediction mode\n");
        break;
    }
}